

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_info.h
# Opt level: O0

void __thiscall
pybind11::buffer_info::buffer_info
          (buffer_info *this,void *ptr,ssize_t itemsize,string *format,ssize_t ndim,
          any_container<long> *shape_in,any_container<long> *strides_in,bool readonly)

{
  size_type sVar1;
  reference pvVar2;
  string *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  ulong in_R8;
  any_container *in_R9;
  any_container *in_stack_00000008;
  byte in_stack_00000010;
  size_t i;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff58;
  vector<long,_std::allocator<long>_> *in_stack_ffffffffffffff60;
  ulong uVar3;
  char *reason;
  size_type local_50;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  in_RDI[2] = 1;
  std::__cxx11::string::string((string *)(in_RDI + 3),in_RCX);
  in_RDI[7] = in_R8;
  detail::any_container::operator_cast_to_vector__(in_R9);
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  reason = (char *)(in_RDI + 0xb);
  detail::any_container::operator_cast_to_vector__(in_stack_00000008);
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(byte *)(in_RDI + 0xe) = in_stack_00000010 & 1;
  in_RDI[0xf] = 0;
  *(undefined1 *)(in_RDI + 0x10) = 0;
  sVar1 = std::vector<long,_std::allocator<long>_>::size
                    ((vector<long,_std::allocator<long>_> *)(in_RDI + 8));
  if (in_R8 == sVar1) {
    uVar3 = in_R8;
    sVar1 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)(in_RDI + 0xb));
    if (uVar3 == sVar1) {
      for (local_50 = 0; local_50 < in_R8; local_50 = local_50 + 1) {
        pvVar2 = std::vector<long,_std::allocator<long>_>::operator[]
                           ((vector<long,_std::allocator<long>_> *)(in_RDI + 8),local_50);
        in_RDI[2] = *pvVar2 * in_RDI[2];
      }
      return;
    }
  }
  pybind11_fail(reason);
}

Assistant:

buffer_info(void *ptr, ssize_t itemsize, const std::string &format, ssize_t ndim,
                detail::any_container<ssize_t> shape_in, detail::any_container<ssize_t> strides_in, bool readonly=false)
    : ptr(ptr), itemsize(itemsize), size(1), format(format), ndim(ndim),
      shape(std::move(shape_in)), strides(std::move(strides_in)), readonly(readonly) {
        if (ndim != (ssize_t) shape.size() || ndim != (ssize_t) strides.size())
            pybind11_fail("buffer_info: ndim doesn't match shape and/or strides length");
        for (size_t i = 0; i < (size_t) ndim; ++i)
            size *= shape[i];
    }